

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Exec
          (ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *this,Matcher *matcher,Char *input,
          CharCount inputLength,CharCount *matchStart,CharCount *inputOffset,
          CharCount *nextSyncInputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,uint *qcTicks,bool firstIteration)

{
  Char CVar1;
  uint uVar2;
  int iVar3;
  Type pRVar4;
  code *pcVar5;
  bool bVar6;
  GroupInfo *pGVar7;
  undefined4 *puVar8;
  char *pcVar9;
  ulong uVar10;
  
  pGVar7 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  if (pGVar7->length != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xf30,"(matcher.GroupIdToGroupInfo(groupId)->IsUndefined())",
                       "matcher.GroupIdToGroupInfo(groupId)->IsUndefined()");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  uVar2 = *inputOffset;
  uVar10 = (ulong)uVar2;
  CVar1 = (this->super_CharMixin).c;
  pRVar4 = matcher->stats;
  if (pRVar4 != (Type)0x0) {
    pRVar4->numCompares = pRVar4->numCompares + 1;
  }
  while( true ) {
    if (pRVar4 != (Type)0x0) {
      pRVar4->numCompares = pRVar4->numCompares + 1;
    }
    if ((inputLength <= uVar10) || (input[uVar10] != CVar1)) break;
    uVar10 = uVar10 + 1;
    *inputOffset = (CharCount)uVar10;
  }
  if ((this->super_NoNeedToSaveMixin).noNeedToSave == false) {
    pcVar9 = ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::
             Push<UnifiedRegex::ResetGroupCont>
                       (&contStack->
                         super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>);
    iVar3 = (this->super_GroupMixin).groupId;
    pcVar9[8] = '\x03';
    *(undefined ***)pcVar9 = &PTR_Print_013e0248;
    *(int *)(pcVar9 + 0xc) = iVar3;
    Matcher::PushStats(matcher,contStack,input);
  }
  pGVar7 = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  pGVar7->offset = uVar2;
  pGVar7->length = *inputOffset - uVar2;
  *instPointer = *instPointer + 8;
  return false;
}

Assistant:

inline bool ChompCharGroupInst<Mode>::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        Assert(matcher.GroupIdToGroupInfo(groupId)->IsUndefined());

        const CharCount inputStartOffset = inputOffset;
        const Char matchC = c;
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        if(Mode == ChompMode::Star || (inputOffset < inputLength && input[inputOffset] == matchC))
        {
            while (true)
            {
                if (Mode != ChompMode::Star)
                {
                    ++inputOffset;
                }
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.CompStats();
#endif
                if (inputOffset < inputLength && input[inputOffset] == matchC)
                {
                    if (Mode == ChompMode::Star)
                    {
                        ++inputOffset;
                    }
                    continue;
                }
                break;
            }

            if (!noNeedToSave)
            {
                // UNDO ACTION: Restore group on backtrack
                PUSH(contStack, ResetGroupCont, groupId);
#if ENABLE_REGEX_CONFIG_OPTIONS
                matcher.PushStats(contStack, input);
#endif
            }

            GroupInfo *const groupInfo = matcher.GroupIdToGroupInfo(groupId);
            groupInfo->offset = inputStartOffset;
            groupInfo->length = inputOffset - inputStartOffset;

            instPointer += sizeof(*this);
            return false;
        }

        return matcher.Fail(FAIL_PARAMETERS);
    }